

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O1

char * equip_describe(player *p,wchar_t slot)

{
  ushort uVar1;
  equip_slot *peVar2;
  char *pcVar3;
  
  peVar2 = (p->body).slots;
  uVar1 = peVar2[slot].type;
  if ((uVar1 == 1) && (((p->state).heavy_wield != false || ((p->state).heavy_shoot == true)))) {
    return "just lifting";
  }
  if (slot_table[uVar1].name_in_desc == true) {
    pcVar3 = format(slot_table[uVar1].describe,peVar2[slot].name);
    return pcVar3;
  }
  return slot_table[uVar1].describe;
}

Assistant:

const char *equip_describe(struct player *p, int slot)
{
	int type = p->body.slots[slot].type;

	/* Heavy */
	if ((type == EQUIP_WEAPON && p->state.heavy_wield) ||
			(type == EQUIP_WEAPON && p->state.heavy_shoot))
		return slot_table[type].heavy_describe;
	else if (slot_table[type].name_in_desc)
		return format(slot_table[type].describe, p->body.slots[slot].name);
	else
		return slot_table[type].describe;
}